

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O2

string * __thiscall
interval::str_abi_cxx11_(string *__return_storage_ptr__,interval *this,Interval i)

{
  string s;
  string f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  istr_abi_cxx11_(&local_50,(int)this);
  istr_abi_cxx11_(&local_70,(int)((ulong)this >> 0x20));
  std::operator+(&local_d0,"[",&local_50);
  std::operator+(&local_b0,&local_d0,",");
  std::operator+(&local_90,&local_b0,&local_70);
  std::operator+(__return_storage_ptr__,&local_90,"]");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string interval::str(Interval i) {
  std::string f = istr(lower(i));
  std::string s = istr(upper(i));
  return "[" + f + "," + s + "]";
}